

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

time_t get_ustar_max_mtime(void)

{
  return 0x1ffffffff;
}

Assistant:

static time_t
get_ustar_max_mtime(void)
{
	/*
	 * Technically, the mtime field in the ustar header can
	 * support 33 bits. We are using all of them to keep
	 * tar/test/test_option_C_mtree.c simple and passing after 2038.
	 * For platforms that use signed 32-bit time values we
	 * use the 32-bit maximum.
	 */
	if (sizeof(time_t) > sizeof(int32_t))
		return (time_t)0x1ffffffff;
	else
		return (time_t)0x7fffffff;
}